

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.h
# Opt level: O3

CostType __thiscall wasm::CostAnalyzer::visitCallIndirect(CostAnalyzer *this,CallIndirect *curr)

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  CostType CVar4;
  
  uVar2 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                    ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)this,curr->target);
  CVar4 = uVar2 + 6;
  sVar1 = (curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
  if (sVar1 != 0) {
    uVar3 = 0;
    do {
      if ((curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements <=
          uVar3) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      uVar2 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                        ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)this,
                         (curr->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                         data[uVar3]);
      CVar4 = CVar4 + uVar2;
      uVar3 = uVar3 + 1;
    } while (sVar1 != uVar3);
  }
  return CVar4;
}

Assistant:

CostType visitCallIndirect(CallIndirect* curr) {
    CostType ret = 6 + visit(curr->target);
    for (auto* child : curr->operands) {
      ret += visit(child);
    }
    return ret;
  }